

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improvePartitions(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                    *this)

{
  _Bit_const_iterator __last;
  _Bit_const_iterator __first;
  size_type sVar1;
  bool bVar2;
  size_t sVar3;
  ostream *this_00;
  void *this_01;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *pDVar5;
  long in_RDI;
  const_iterator cVar6;
  VertexIterator it_1;
  VertexIterator it;
  size_t partition_1;
  size_t partition;
  size_t additionalMoves_1;
  size_t partitionA_1;
  size_t additionalMoves;
  size_t partitionB;
  size_t partitionA;
  int numberOfUpdatedCells;
  size_t idx;
  size_t numberOfMoves;
  size_t in_stack_00000270;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_00000278;
  size_t in_stack_000007b8;
  size_t in_stack_000007c0;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *in_stack_000007c8;
  _Bit_reference *in_stack_fffffffffffffdd8;
  _Bit_reference *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  bool bVar7;
  undefined8 in_stack_fffffffffffffdf0;
  ulong uVar8;
  size_type in_stack_fffffffffffffdf8;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this_02;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe00;
  vector<bool,_std::allocator<bool>_> *this_03;
  size_t in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  byte bVar9;
  reference local_1c0 [2];
  reference local_1a0 [2];
  reference local_180;
  reference local_170;
  ulong local_160;
  reference local_158;
  reference local_148;
  reference local_138;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_128;
  reference local_120;
  size_t local_110;
  reference local_108;
  vector<bool,_std::allocator<bool>_> *local_f8;
  reference local_f0;
  reference local_e0;
  size_t local_d0;
  reference local_c8;
  reference local_b8;
  ulong local_a8;
  ulong local_a0;
  int local_94;
  _Bit_type *local_90;
  uint local_88;
  _Bit_type *local_80;
  uint local_78;
  _Bit_type *local_70;
  uint local_68;
  _Bit_type *local_60;
  uint local_58;
  int local_4c;
  reference local_48;
  reference local_38;
  reference local_28;
  ulong local_18;
  size_t local_10;
  
  local_10 = 0;
  for (local_18 = 0; uVar8 = local_18,
      sVar3 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1d8b5f)
      , uVar8 < sVar3; local_18 = local_18 + 1) {
    local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::_Bit_reference::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::_Bit_reference::operator=(&local_48,false);
  }
  cVar6 = std::vector<bool,_std::allocator<bool>_>::cbegin
                    ((vector<bool,_std::allocator<bool>_> *)0x1d8c3e);
  local_70 = cVar6.super__Bit_iterator_base._M_p;
  local_68 = cVar6.super__Bit_iterator_base._M_offset;
  local_60 = local_70;
  local_58 = local_68;
  cVar6 = std::vector<bool,_std::allocator<bool>_>::cend
                    ((vector<bool,_std::allocator<bool>_> *)0x1d8c75);
  local_90 = cVar6.super__Bit_iterator_base._M_p;
  local_88 = cVar6.super__Bit_iterator_base._M_offset;
  __first.super__Bit_iterator_base._M_p._7_1_ = in_stack_fffffffffffffdef;
  __first.super__Bit_iterator_base._M_p._0_7_ = in_stack_fffffffffffffde8;
  __first.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffdf0;
  __last.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffde0;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)in_stack_fffffffffffffdd8;
  local_80 = local_90;
  local_78 = local_88;
  local_4c = std::accumulate<std::_Bit_const_iterator,int>(__first,__last,0);
  local_94 = (int)std::setw(0xf);
  this_00 = std::operator<<((ostream *)&std::cout,(_Setw)local_94);
  this_01 = (void *)std::ostream::operator<<(this_00,local_4c);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  local_a0 = 0;
  do {
    uVar8 = local_a0;
    sVar3 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
            numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1d8d38);
    sVar1 = local_a0;
    if (sVar3 - 1 <= uVar8) {
      local_f8 = (vector<bool,_std::allocator<bool>_> *)0x0;
      while (this_03 = local_f8,
            pvVar4 = (vector<bool,_std::allocator<bool>_> *)
                     andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                     numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                                      0x1d8fe4), this_03 < pvVar4) {
        local_108 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (this_03,in_stack_fffffffffffffdf8);
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_108);
        if ((((bVar2 ^ 0xffU) & 1) == 0) &&
           (local_110 = splitPartition(in_stack_00000278,in_stack_00000270), local_110 != 0)) {
          local_120 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (this_03,in_stack_fffffffffffffdf8);
          std::_Bit_reference::operator=(&local_120,true);
          local_10 = local_110 + local_10;
          HeuristicBase::logObj(&this->super_HeuristicBase);
        }
        local_f8 = (vector<bool,_std::allocator<bool>_> *)
                   ((long)&(local_f8->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
      }
      local_128 = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x0;
      while (this_02 = local_128,
            pDVar5 = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                     andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                     numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                                      0x1d90fc), this_02 < pDVar5) {
        local_138 = std::vector<bool,_std::allocator<bool>_>::operator[](this_03,(size_type)this_02)
        ;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_138);
        if (bVar2) {
          local_148 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (this_03,(size_type)this_02);
          std::_Bit_reference::operator=(&local_148,true);
        }
        else {
          local_158 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (this_03,(size_type)this_02);
          std::_Bit_reference::operator=(&local_158,false);
        }
        local_128 = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                    ((long)&(local_128->vertices_).
                            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_160 = 0;
      while (uVar8 = local_160,
            sVar3 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                    numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                                     0x1d9200), uVar8 < sVar3) {
        local_170 = std::vector<bool,_std::allocator<bool>_>::operator[](this_03,(size_type)this_02)
        ;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_170);
        bVar7 = false;
        if (bVar2) {
          local_180 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (this_03,(size_type)this_02);
          bVar7 = std::_Bit_reference::operator_cast_to_bool(&local_180);
        }
        if (bVar7 != false) {
          andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
          verticesFromVertexBegin(this_02,uVar8);
          while( true ) {
            andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
            verticesFromVertexEnd(this_02,uVar8);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)in_stack_fffffffffffffde0,
                               (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)in_stack_fffffffffffffdd8);
            if (!bVar2) break;
            in_stack_fffffffffffffde0 = (_Bit_reference *)(in_RDI + 0x138);
            andres::graph::detail::IteratorHelper<true>::operator*((IteratorHelper<true> *)0x1d9311)
            ;
            local_1a0[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     (this_03,(size_type)this_02);
            std::_Bit_reference::operator=(local_1a0,true);
            andres::graph::detail::IteratorHelper<true>::operator++
                      ((IteratorHelper<true> *)in_stack_fffffffffffffde0);
          }
          andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
          verticesToVertexBegin(this_02,uVar8);
          while( true ) {
            andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
            verticesToVertexEnd(this_02,uVar8);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)in_stack_fffffffffffffde0,
                               (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)in_stack_fffffffffffffdd8);
            if (!bVar2) break;
            in_stack_fffffffffffffdd8 = (_Bit_reference *)(in_RDI + 0x138);
            andres::graph::detail::IteratorHelper<true>::operator*((IteratorHelper<true> *)0x1d93bf)
            ;
            local_1c0[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     (this_03,(size_type)this_02);
            std::_Bit_reference::operator=(local_1c0,true);
            andres::graph::detail::IteratorHelper<true>::operator++
                      ((IteratorHelper<true> *)in_stack_fffffffffffffde0);
          }
        }
        local_160 = local_160 + 1;
      }
      return local_10;
    }
    while( true ) {
      local_a8 = sVar1 + 1;
      uVar8 = local_a8;
      sVar3 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1d8d7c)
      ;
      if (sVar3 <= uVar8) break;
      std::
      vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0x98),local_a0);
      bVar2 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x1d8db2);
      if (bVar2) break;
      std::
      vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0x98),local_a8);
      bVar2 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x1d8de2);
      sVar1 = local_a8;
      if (!bVar2) {
        local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
        bVar9 = 0;
        if (!bVar2) {
          local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
          bVar9 = bVar2 ^ 0xff;
        }
        sVar1 = local_a8;
        if ((bVar9 & 1) == 0) {
          in_stack_fffffffffffffe08 =
               PartitionGraph::frameOfPartition
                         ((PartitionGraph *)CONCAT17(bVar9,in_stack_fffffffffffffe10),
                          in_stack_fffffffffffffe08);
          sVar3 = PartitionGraph::frameOfPartition
                            ((PartitionGraph *)CONCAT17(bVar9,in_stack_fffffffffffffe10),
                             in_stack_fffffffffffffe08);
          sVar1 = local_a8;
          if ((in_stack_fffffffffffffe08 == sVar3) &&
             (local_d0 = improveBipartition(in_stack_000007c8,in_stack_000007c0,in_stack_000007b8),
             sVar1 = local_a8, local_d0 != 0)) {
            local_e0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            std::_Bit_reference::operator=(&local_e0,true);
            local_f0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            std::_Bit_reference::operator=(&local_f0,true);
            local_10 = local_d0 + local_10;
            HeuristicBase::logObj(&this->super_HeuristicBase);
            sVar1 = local_a8;
          }
        }
      }
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improvePartitions()
{
    size_t numberOfMoves = 0;

    // update "dirty" flags.
    for (size_t idx = 0; idx < partitionGraph_.numberOfVertices(); ++idx) {
        needsUpdate_[idx] = changed_[idx];
        changed_[idx] = false;
    }

    {
        // complete info line.
        const auto numberOfUpdatedCells =
            std::accumulate(needsUpdate_.cbegin(), needsUpdate_.cend(), 0);
        std::cout << std::setw(WIDTH) << numberOfUpdatedCells << std::endl;
    }

    for (size_t partitionA = 0;
         partitionA < partitionGraph_.numberOfVertices() - 1; ++partitionA) {

        for (size_t partitionB = partitionA + 1;
             partitionB < partitionGraph_.numberOfVertices(); ++partitionB) {

            if (partitionGraph_.partitions_[partitionA].empty())
                break;
            if (partitionGraph_.partitions_[partitionB].empty())
                continue;

            // check if "dirty"
            if (!needsUpdate_[partitionA] && !needsUpdate_[partitionB]) {
                continue;
            }

            // check whether the partitions are in the same frame.
            // proximity (i.e. presence of an edge between them) will be
            // tested
            // implicitly in improveBipartition.
            if (partitionGraph_.frameOfPartition(partitionA) !=
                partitionGraph_.frameOfPartition(partitionB)) {
                continue;
            }

            const auto additionalMoves =
                improveBipartition(partitionA, partitionB);

            if (additionalMoves > 0) {
                changed_[partitionA] = true;
                changed_[partitionB] = true;
                numberOfMoves += additionalMoves;

                this->logObj();
            }
        }
    }

    // introduce new partitions.
    for (size_t partitionA = 0; partitionA < partitionGraph_.numberOfVertices();
         ++partitionA) {
        if (!needsUpdate_[partitionA]) {
            continue;
        }

        const auto additionalMoves = splitPartition(partitionA);

        if (additionalMoves > 0) {
            changed_[partitionA] = true;
            numberOfMoves += additionalMoves;

            this->logObj();
        }
    }

    // propagate "changed" flags along branching edges.
    // First, transfer flags to needsUpdate_ to prevent propagation
    // in the entire connected component.
    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition]) {
            needsUpdate_[partition] = true;
        } else {
            needsUpdate_[partition] = false;
        }
    }

    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition] && needsUpdate_[partition]) {

            for (auto it = partitionGraph_.verticesFromVertexBegin(partition);
                 it != partitionGraph_.verticesFromVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }

            for (auto it = partitionGraph_.verticesToVertexBegin(partition);
                 it != partitionGraph_.verticesToVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }
        }
    }

    return numberOfMoves;
}